

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeoIPCity.c
# Opt level: O0

int GeoIP_record_id_by_addr(GeoIP *gi,char *addr)

{
  unsigned_long ipnum_00;
  unsigned_long ipnum;
  char *addr_local;
  GeoIP *gi_local;
  
  if ((gi->databaseType == '\x06') || (gi->databaseType == '\x02')) {
    if (addr == (char *)0x0) {
      gi_local._4_4_ = 0;
    }
    else {
      ipnum_00 = _GeoIP_addr_to_num(addr);
      gi_local._4_4_ = _GeoIP_seek_record(gi,ipnum_00);
    }
  }
  else {
    printf("Invalid database type %s, expected %s\n",GeoIPDBDescription[(int)gi->databaseType],
           GeoIPDBDescription[2]);
    gi_local._4_4_ = 0;
  }
  return gi_local._4_4_;
}

Assistant:

int GeoIP_record_id_by_addr (GeoIP* gi, const char *addr) {
	unsigned long ipnum;
	if (gi->databaseType != GEOIP_CITY_EDITION_REV0 &&
			gi->databaseType != GEOIP_CITY_EDITION_REV1) {
		printf("Invalid database type %s, expected %s\n", GeoIPDBDescription[(int)gi->databaseType], GeoIPDBDescription[GEOIP_CITY_EDITION_REV1]);
		return 0;
	}
	if (addr == NULL) {
		return 0;
	}
	ipnum = _GeoIP_addr_to_num(addr);
	return _GeoIP_seek_record(gi, ipnum);
}